

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::UnitTestOptions::FilterMatchesTest
               (string *test_suite_name,string *test_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar1;
  char *pcVar2;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  size_type *local_88;
  string negative;
  string str;
  string positive;
  
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&negative.field_2 + 8);
  std::operator+(__return_storage_ptr__,test_suite_name,".");
  std::operator+(&local_c8,__return_storage_ptr__,(test_name->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)(negative.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(negative.field_2._M_local_buf + 8),(string *)FLAGS_gtest_filter_abi_cxx11_);
  pcVar2 = strchr((char *)negative.field_2._8_8_,0x2d);
  str.field_2._8_8_ = &positive._M_string_length;
  positive._M_dataplus._M_p = (pointer)0x0;
  local_88 = &negative._M_string_length;
  negative._M_dataplus._M_p = (pointer)0x0;
  positive._M_string_length._0_1_ = 0;
  negative._M_string_length._0_1_ = 0;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::assign(str.field_2._M_local_buf + 8);
    this = (string *)&local_88;
  }
  else {
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,negative.field_2._8_8_,pcVar2);
    this = (string *)(str.field_2._M_local_buf + 8);
    std::__cxx11::string::operator=(this,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,pcVar2 + 1,
               (allocator<char> *)(positive.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator=((string *)&local_88,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    if (positive._M_dataplus._M_p != (pointer)0x0) goto LAB_00151216;
  }
  std::__cxx11::string::assign((char *)this);
LAB_00151216:
  bVar1 = MatchesFilter(&local_c8,(char *)str.field_2._8_8_);
  if (bVar1) {
    bVar1 = MatchesFilter(&local_c8,(char *)local_88);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(negative.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_c8);
  return bVar1;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string& test_suite_name,
                                        const std::string& test_name) {
  const std::string& full_name = test_suite_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  std::string str = GTEST_FLAG_GET(filter);
  const char* const p = str.c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == nullptr) {
    positive = str.c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}